

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printing.h
# Opt level: O0

ostream * printText(ostream *o,string_view str,bool needQuotes)

{
  bool needQuotes_local;
  ostream *o_local;
  string_view str_local;
  
  if (needQuotes) {
    std::operator<<(o,'\"');
  }
  Colors::green(o);
  std::operator<<(o,str);
  Colors::normal(o);
  if (needQuotes) {
    std::operator<<(o,'\"');
  }
  return o;
}

Assistant:

inline std::ostream&
printText(std::ostream& o, std::string_view str, bool needQuotes = true) {
  if (needQuotes) {
    o << '"';
  }
  Colors::green(o);
  o << str;
  Colors::normal(o);
  if (needQuotes) {
    o << '"';
  }
  return o;
}